

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O0

fdb_status wal_snapshot_clone(snap_handle *shandle_in,snap_handle **shandle_out,fdb_seqnum_t seqnum)

{
  atomic<unsigned_short> *in_RDX;
  long *in_RSI;
  long in_RDI;
  memory_order in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  if ((in_RDX == (atomic<unsigned_short> *)0xffffffffffffffff) ||
     (*(atomic<unsigned_short> **)(in_RDI + 0x40) == in_RDX)) {
    atomic_incr_uint16_t(in_RDX,in_stack_ffffffffffffffdc);
    *in_RSI = in_RDI;
    local_4 = FDB_RESULT_SUCCESS;
  }
  else {
    local_4 = FDB_RESULT_INVALID_ARGS;
  }
  return local_4;
}

Assistant:

fdb_status wal_snapshot_clone(struct snap_handle *shandle_in,
                              struct snap_handle **shandle_out,
                              fdb_seqnum_t seqnum)
{
    if (seqnum == FDB_SNAPSHOT_INMEM ||
        shandle_in->seqnum == seqnum) {
        atomic_incr_uint16_t(&shandle_in->ref_cnt_kvs);
        *shandle_out = shandle_in;
        return FDB_RESULT_SUCCESS;
    }
    return FDB_RESULT_INVALID_ARGS;
}